

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

string * __thiscall
chrono::ChValueSpecific<std::__cxx11::list<double,_std::allocator<double>_>_>::
GetClassRegisteredName(ChValueSpecific<std::__cxx11::list<double,_std::allocator<double>_>_> *this)

{
  int iVar1;
  string *psVar2;
  allocator local_11;
  
  if (ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>::GetClassRegisteredName()::
      nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>
                                 ::GetClassRegisteredName()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>::
                  GetClassRegisteredName()::nostring_abi_cxx11_,"",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>::
                    GetClassRegisteredName()::nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>::
                           GetClassRegisteredName()::nostring_abi_cxx11_);
    }
  }
  psVar2 = &ChValueSpecific<std::__cxx11::list<double,std::allocator<double>>>::
            GetClassRegisteredName()::nostring_abi_cxx11_;
  if (this->_ptr_to_val != (list<double,_std::allocator<double>_> *)0x0) {
    psVar2 = ChClassFactory::GetClassTagName_abi_cxx11_
                       ((type_info *)&std::__cxx11::list<double,std::allocator<double>>::typeinfo);
  }
  return psVar2;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }